

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.c
# Opt level: O0

U64 XXH64_finalize(U64 h64,void *ptr,size_t len,XXH_endianess endian,XXH_alignment align)

{
  U32 UVar1;
  U64 UVar2;
  ulong uVar3;
  U32 local_540;
  U32 local_53c;
  U64 local_538;
  U64 local_530;
  U64 local_528;
  U64 local_520;
  U64 local_518;
  U64 local_510;
  U64 local_508;
  U64 local_500;
  U64 local_4f8;
  U64 local_4f0;
  U64 local_4e8;
  U64 local_4e0;
  U32 local_4d8;
  U32 local_4d4;
  U64 local_4d0;
  U64 local_4c8;
  U64 local_4c0;
  U64 local_4b8;
  U64 local_4b0;
  U64 local_4a8;
  U64 local_4a0;
  U64 local_498;
  U64 local_490;
  U64 local_488;
  U64 local_480;
  U64 local_478;
  U32 local_470;
  U32 local_46c;
  U64 local_468;
  U64 local_460;
  U64 local_458;
  U64 local_450;
  U64 local_448;
  U64 local_440;
  U64 local_438;
  U64 local_430;
  U64 local_428;
  U64 local_420;
  U64 local_418;
  U64 local_410;
  U32 local_408;
  U32 local_404;
  U64 local_400;
  U64 local_3f8;
  U64 local_3f0;
  U64 local_3e8;
  U64 local_3e0;
  U64 local_3d8;
  U64 local_3d0;
  U64 local_3c8;
  U64 local_3c0;
  U64 local_3b8;
  U64 local_3b0;
  U64 local_3a8;
  U64 k1_23;
  U64 k1_22;
  U64 k1_21;
  U64 k1_20;
  U64 k1_19;
  U64 k1_18;
  U64 k1_17;
  U64 k1_16;
  U64 k1_15;
  U64 k1_14;
  U64 k1_13;
  U64 k1_12;
  U64 k1_11;
  U64 k1_10;
  U64 k1_9;
  U64 k1_8;
  U64 k1_7;
  U64 k1_6;
  U64 k1_5;
  U64 k1_4;
  U64 k1_3;
  U64 k1_2;
  U64 k1_1;
  U64 k1;
  BYTE *p;
  XXH_alignment align_local;
  XXH_endianess endian_local;
  size_t len_local;
  void *ptr_local;
  U64 h64_local;
  U32 local_294;
  U32 local_27c;
  U32 local_264;
  U32 local_24c;
  U64 local_238;
  U64 local_220;
  U64 local_208;
  U64 local_1f0;
  U64 local_1d8;
  U64 local_1c0;
  U64 local_1a8;
  U64 local_190;
  U64 local_178;
  U64 local_160;
  U64 local_148;
  U64 local_130;
  U64 local_118;
  U64 local_100;
  U64 local_e8;
  U64 local_d0;
  U64 local_b8;
  U64 local_a0;
  U64 local_88;
  U64 local_70;
  U64 local_58;
  U64 local_40;
  U64 local_28;
  U64 local_10;
  
  k1 = (U64)ptr;
  ptr_local = (void *)h64;
  switch((uint)len & 0x1f) {
  case 0x18:
    if (align == XXH_unaligned) {
      if (endian == XXH_littleEndian) {
        local_3a8 = XXH_read64(ptr);
      }
      else {
        UVar2 = XXH_read64(ptr);
        local_3a8 = XXH_swap64(UVar2);
      }
      local_10 = local_3a8;
    }
    else {
      if (endian == XXH_littleEndian) {
        local_3b0 = *ptr;
      }
      else {
        local_3b0 = XXH_swap64(*ptr);
      }
      local_10 = local_3b0;
    }
    UVar2 = XXH64_round(0,local_10);
    k1 = (long)ptr + 8;
    ptr_local = (void *)(((UVar2 ^ h64) << 0x1b | (UVar2 ^ h64) >> 0x25) * -0x61c8864e7a143579 +
                        -0x7a1435883d4d519d);
  case 0x10:
    if (align == XXH_unaligned) {
      if (endian == XXH_littleEndian) {
        local_3b8 = XXH_read64((void *)k1);
      }
      else {
        UVar2 = XXH_read64((void *)k1);
        local_3b8 = XXH_swap64(UVar2);
      }
      local_28 = local_3b8;
    }
    else {
      if (endian == XXH_littleEndian) {
        local_3c0 = *(U64 *)k1;
      }
      else {
        local_3c0 = XXH_swap64(*(U64 *)k1);
      }
      local_28 = local_3c0;
    }
    UVar2 = XXH64_round(0,local_28);
    k1 = k1 + 8;
    ptr_local = (void *)(((UVar2 ^ (ulong)ptr_local) << 0x1b | (UVar2 ^ (ulong)ptr_local) >> 0x25) *
                         -0x61c8864e7a143579 + -0x7a1435883d4d519d);
  case 8:
    if (align == XXH_unaligned) {
      if (endian == XXH_littleEndian) {
        local_3c8 = XXH_read64((void *)k1);
      }
      else {
        UVar2 = XXH_read64((void *)k1);
        local_3c8 = XXH_swap64(UVar2);
      }
      local_40 = local_3c8;
    }
    else {
      if (endian == XXH_littleEndian) {
        local_3d0 = *(U64 *)k1;
      }
      else {
        local_3d0 = XXH_swap64(*(U64 *)k1);
      }
      local_40 = local_3d0;
    }
    UVar2 = XXH64_round(0,local_40);
    h64_local = XXH64_avalanche(((UVar2 ^ (ulong)ptr_local) << 0x1b |
                                (UVar2 ^ (ulong)ptr_local) >> 0x25) * -0x61c8864e7a143579 +
                                0x85ebca77c2b2ae63);
    break;
  case 0x19:
    if (align == XXH_unaligned) {
      if (endian == XXH_littleEndian) {
        local_410 = XXH_read64(ptr);
      }
      else {
        UVar2 = XXH_read64(ptr);
        local_410 = XXH_swap64(UVar2);
      }
      local_a0 = local_410;
    }
    else {
      if (endian == XXH_littleEndian) {
        local_418 = *ptr;
      }
      else {
        local_418 = XXH_swap64(*ptr);
      }
      local_a0 = local_418;
    }
    UVar2 = XXH64_round(0,local_a0);
    k1 = (long)ptr + 8;
    ptr_local = (void *)(((UVar2 ^ h64) << 0x1b | (UVar2 ^ h64) >> 0x25) * -0x61c8864e7a143579 +
                        -0x7a1435883d4d519d);
  case 0x11:
    if (align == XXH_unaligned) {
      if (endian == XXH_littleEndian) {
        local_420 = XXH_read64((void *)k1);
      }
      else {
        UVar2 = XXH_read64((void *)k1);
        local_420 = XXH_swap64(UVar2);
      }
      local_b8 = local_420;
    }
    else {
      if (endian == XXH_littleEndian) {
        local_428 = *(U64 *)k1;
      }
      else {
        local_428 = XXH_swap64(*(U64 *)k1);
      }
      local_b8 = local_428;
    }
    UVar2 = XXH64_round(0,local_b8);
    k1 = k1 + 8;
    ptr_local = (void *)(((UVar2 ^ (ulong)ptr_local) << 0x1b | (UVar2 ^ (ulong)ptr_local) >> 0x25) *
                         -0x61c8864e7a143579 + -0x7a1435883d4d519d);
  case 9:
    if (align == XXH_unaligned) {
      if (endian == XXH_littleEndian) {
        local_430 = XXH_read64((void *)k1);
      }
      else {
        UVar2 = XXH_read64((void *)k1);
        local_430 = XXH_swap64(UVar2);
      }
      local_d0 = local_430;
    }
    else {
      if (endian == XXH_littleEndian) {
        local_438 = *(U64 *)k1;
      }
      else {
        local_438 = XXH_swap64(*(U64 *)k1);
      }
      local_d0 = local_438;
    }
    UVar2 = XXH64_round(0,local_d0);
    uVar3 = (ulong)*(byte *)(k1 + 8) * 0x27d4eb2f165667c5 ^
            ((UVar2 ^ (ulong)ptr_local) << 0x1b | (UVar2 ^ (ulong)ptr_local) >> 0x25) *
            -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
    h64_local = XXH64_avalanche((uVar3 << 0xb | uVar3 >> 0x35) * -0x61c8864e7a143579);
    break;
  case 0x1a:
    if (align == XXH_unaligned) {
      if (endian == XXH_littleEndian) {
        local_478 = XXH_read64(ptr);
      }
      else {
        UVar2 = XXH_read64(ptr);
        local_478 = XXH_swap64(UVar2);
      }
      local_130 = local_478;
    }
    else {
      if (endian == XXH_littleEndian) {
        local_480 = *ptr;
      }
      else {
        local_480 = XXH_swap64(*ptr);
      }
      local_130 = local_480;
    }
    UVar2 = XXH64_round(0,local_130);
    k1 = (long)ptr + 8;
    ptr_local = (void *)(((UVar2 ^ h64) << 0x1b | (UVar2 ^ h64) >> 0x25) * -0x61c8864e7a143579 +
                        -0x7a1435883d4d519d);
  case 0x12:
    if (align == XXH_unaligned) {
      if (endian == XXH_littleEndian) {
        local_488 = XXH_read64((void *)k1);
      }
      else {
        UVar2 = XXH_read64((void *)k1);
        local_488 = XXH_swap64(UVar2);
      }
      local_148 = local_488;
    }
    else {
      if (endian == XXH_littleEndian) {
        local_490 = *(U64 *)k1;
      }
      else {
        local_490 = XXH_swap64(*(U64 *)k1);
      }
      local_148 = local_490;
    }
    UVar2 = XXH64_round(0,local_148);
    k1 = k1 + 8;
    ptr_local = (void *)(((UVar2 ^ (ulong)ptr_local) << 0x1b | (UVar2 ^ (ulong)ptr_local) >> 0x25) *
                         -0x61c8864e7a143579 + -0x7a1435883d4d519d);
  case 10:
    if (align == XXH_unaligned) {
      if (endian == XXH_littleEndian) {
        local_498 = XXH_read64((void *)k1);
      }
      else {
        UVar2 = XXH_read64((void *)k1);
        local_498 = XXH_swap64(UVar2);
      }
      local_160 = local_498;
    }
    else {
      if (endian == XXH_littleEndian) {
        local_4a0 = *(U64 *)k1;
      }
      else {
        local_4a0 = XXH_swap64(*(U64 *)k1);
      }
      local_160 = local_4a0;
    }
    UVar2 = XXH64_round(0,local_160);
    uVar3 = (ulong)*(byte *)(k1 + 8) * 0x27d4eb2f165667c5 ^
            ((UVar2 ^ (ulong)ptr_local) << 0x1b | (UVar2 ^ (ulong)ptr_local) >> 0x25) *
            -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
    uVar3 = (ulong)*(byte *)(k1 + 9) * 0x27d4eb2f165667c5 ^
            (uVar3 << 0xb | uVar3 >> 0x35) * -0x61c8864e7a143579;
    h64_local = XXH64_avalanche((uVar3 << 0xb | uVar3 >> 0x35) * -0x61c8864e7a143579);
    break;
  case 0x1b:
    if (align == XXH_unaligned) {
      if (endian == XXH_littleEndian) {
        local_4e0 = XXH_read64(ptr);
      }
      else {
        UVar2 = XXH_read64(ptr);
        local_4e0 = XXH_swap64(UVar2);
      }
      local_1c0 = local_4e0;
    }
    else {
      if (endian == XXH_littleEndian) {
        local_4e8 = *ptr;
      }
      else {
        local_4e8 = XXH_swap64(*ptr);
      }
      local_1c0 = local_4e8;
    }
    UVar2 = XXH64_round(0,local_1c0);
    k1 = (long)ptr + 8;
    ptr_local = (void *)(((UVar2 ^ h64) << 0x1b | (UVar2 ^ h64) >> 0x25) * -0x61c8864e7a143579 +
                        -0x7a1435883d4d519d);
  case 0x13:
    if (align == XXH_unaligned) {
      if (endian == XXH_littleEndian) {
        local_4f0 = XXH_read64((void *)k1);
      }
      else {
        UVar2 = XXH_read64((void *)k1);
        local_4f0 = XXH_swap64(UVar2);
      }
      local_1d8 = local_4f0;
    }
    else {
      if (endian == XXH_littleEndian) {
        local_4f8 = *(U64 *)k1;
      }
      else {
        local_4f8 = XXH_swap64(*(U64 *)k1);
      }
      local_1d8 = local_4f8;
    }
    UVar2 = XXH64_round(0,local_1d8);
    k1 = k1 + 8;
    ptr_local = (void *)(((UVar2 ^ (ulong)ptr_local) << 0x1b | (UVar2 ^ (ulong)ptr_local) >> 0x25) *
                         -0x61c8864e7a143579 + -0x7a1435883d4d519d);
  case 0xb:
    if (align == XXH_unaligned) {
      if (endian == XXH_littleEndian) {
        local_500 = XXH_read64((void *)k1);
      }
      else {
        UVar2 = XXH_read64((void *)k1);
        local_500 = XXH_swap64(UVar2);
      }
      local_1f0 = local_500;
    }
    else {
      if (endian == XXH_littleEndian) {
        local_508 = *(U64 *)k1;
      }
      else {
        local_508 = XXH_swap64(*(U64 *)k1);
      }
      local_1f0 = local_508;
    }
    UVar2 = XXH64_round(0,local_1f0);
    uVar3 = (ulong)*(byte *)(k1 + 8) * 0x27d4eb2f165667c5 ^
            ((UVar2 ^ (ulong)ptr_local) << 0x1b | (UVar2 ^ (ulong)ptr_local) >> 0x25) *
            -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
    uVar3 = (ulong)*(byte *)(k1 + 9) * 0x27d4eb2f165667c5 ^
            (uVar3 << 0xb | uVar3 >> 0x35) * -0x61c8864e7a143579;
    uVar3 = (ulong)*(byte *)(k1 + 10) * 0x27d4eb2f165667c5 ^
            (uVar3 << 0xb | uVar3 >> 0x35) * -0x61c8864e7a143579;
    h64_local = XXH64_avalanche((uVar3 << 0xb | uVar3 >> 0x35) * -0x61c8864e7a143579);
    break;
  case 0x1c:
    if (align == XXH_unaligned) {
      if (endian == XXH_littleEndian) {
        local_3d8 = XXH_read64(ptr);
      }
      else {
        UVar2 = XXH_read64(ptr);
        local_3d8 = XXH_swap64(UVar2);
      }
      local_58 = local_3d8;
    }
    else {
      if (endian == XXH_littleEndian) {
        local_3e0 = *ptr;
      }
      else {
        local_3e0 = XXH_swap64(*ptr);
      }
      local_58 = local_3e0;
    }
    UVar2 = XXH64_round(0,local_58);
    k1 = (long)ptr + 8;
    ptr_local = (void *)(((UVar2 ^ h64) << 0x1b | (UVar2 ^ h64) >> 0x25) * -0x61c8864e7a143579 +
                        -0x7a1435883d4d519d);
  case 0x14:
    if (align == XXH_unaligned) {
      if (endian == XXH_littleEndian) {
        local_3e8 = XXH_read64((void *)k1);
      }
      else {
        UVar2 = XXH_read64((void *)k1);
        local_3e8 = XXH_swap64(UVar2);
      }
      local_70 = local_3e8;
    }
    else {
      if (endian == XXH_littleEndian) {
        local_3f0 = *(U64 *)k1;
      }
      else {
        local_3f0 = XXH_swap64(*(U64 *)k1);
      }
      local_70 = local_3f0;
    }
    UVar2 = XXH64_round(0,local_70);
    k1 = k1 + 8;
    ptr_local = (void *)(((UVar2 ^ (ulong)ptr_local) << 0x1b | (UVar2 ^ (ulong)ptr_local) >> 0x25) *
                         -0x61c8864e7a143579 + -0x7a1435883d4d519d);
  case 0xc:
    if (align == XXH_unaligned) {
      if (endian == XXH_littleEndian) {
        local_3f8 = XXH_read64((void *)k1);
      }
      else {
        UVar2 = XXH_read64((void *)k1);
        local_3f8 = XXH_swap64(UVar2);
      }
      local_88 = local_3f8;
    }
    else {
      if (endian == XXH_littleEndian) {
        local_400 = *(U64 *)k1;
      }
      else {
        local_400 = XXH_swap64(*(U64 *)k1);
      }
      local_88 = local_400;
    }
    UVar2 = XXH64_round(0,local_88);
    k1 = k1 + 8;
    ptr_local = (void *)(((UVar2 ^ (ulong)ptr_local) << 0x1b | (UVar2 ^ (ulong)ptr_local) >> 0x25) *
                         -0x61c8864e7a143579 + -0x7a1435883d4d519d);
  case 4:
    if (align == XXH_unaligned) {
      if (endian == XXH_littleEndian) {
        local_404 = XXH_read32((void *)k1);
      }
      else {
        UVar1 = XXH_read32((void *)k1);
        local_404 = XXH_swap32(UVar1);
      }
      local_24c = local_404;
    }
    else {
      if (endian == XXH_littleEndian) {
        local_408 = *(U32 *)k1;
      }
      else {
        local_408 = XXH_swap32(*(U32 *)k1);
      }
      local_24c = local_408;
    }
    uVar3 = (ulong)local_24c * -0x61c8864e7a143579 ^ (ulong)ptr_local;
    h64_local = XXH64_avalanche((uVar3 << 0x17 | uVar3 >> 0x29) * -0x3d4d51c2d82b14b1 +
                                0x165667b19e3779f9);
    break;
  case 0x1d:
    if (align == XXH_unaligned) {
      if (endian == XXH_littleEndian) {
        local_440 = XXH_read64(ptr);
      }
      else {
        UVar2 = XXH_read64(ptr);
        local_440 = XXH_swap64(UVar2);
      }
      local_e8 = local_440;
    }
    else {
      if (endian == XXH_littleEndian) {
        local_448 = *ptr;
      }
      else {
        local_448 = XXH_swap64(*ptr);
      }
      local_e8 = local_448;
    }
    UVar2 = XXH64_round(0,local_e8);
    k1 = (long)ptr + 8;
    ptr_local = (void *)(((UVar2 ^ h64) << 0x1b | (UVar2 ^ h64) >> 0x25) * -0x61c8864e7a143579 +
                        -0x7a1435883d4d519d);
  case 0x15:
    if (align == XXH_unaligned) {
      if (endian == XXH_littleEndian) {
        local_450 = XXH_read64((void *)k1);
      }
      else {
        UVar2 = XXH_read64((void *)k1);
        local_450 = XXH_swap64(UVar2);
      }
      local_100 = local_450;
    }
    else {
      if (endian == XXH_littleEndian) {
        local_458 = *(U64 *)k1;
      }
      else {
        local_458 = XXH_swap64(*(U64 *)k1);
      }
      local_100 = local_458;
    }
    UVar2 = XXH64_round(0,local_100);
    k1 = k1 + 8;
    ptr_local = (void *)(((UVar2 ^ (ulong)ptr_local) << 0x1b | (UVar2 ^ (ulong)ptr_local) >> 0x25) *
                         -0x61c8864e7a143579 + -0x7a1435883d4d519d);
  case 0xd:
    if (align == XXH_unaligned) {
      if (endian == XXH_littleEndian) {
        local_460 = XXH_read64((void *)k1);
      }
      else {
        UVar2 = XXH_read64((void *)k1);
        local_460 = XXH_swap64(UVar2);
      }
      local_118 = local_460;
    }
    else {
      if (endian == XXH_littleEndian) {
        local_468 = *(U64 *)k1;
      }
      else {
        local_468 = XXH_swap64(*(U64 *)k1);
      }
      local_118 = local_468;
    }
    UVar2 = XXH64_round(0,local_118);
    k1 = k1 + 8;
    ptr_local = (void *)(((UVar2 ^ (ulong)ptr_local) << 0x1b | (UVar2 ^ (ulong)ptr_local) >> 0x25) *
                         -0x61c8864e7a143579 + -0x7a1435883d4d519d);
  case 5:
    if (align == XXH_unaligned) {
      if (endian == XXH_littleEndian) {
        local_46c = XXH_read32((void *)k1);
      }
      else {
        UVar1 = XXH_read32((void *)k1);
        local_46c = XXH_swap32(UVar1);
      }
      local_264 = local_46c;
    }
    else {
      if (endian == XXH_littleEndian) {
        local_470 = *(U32 *)k1;
      }
      else {
        local_470 = XXH_swap32(*(U32 *)k1);
      }
      local_264 = local_470;
    }
    uVar3 = (ulong)local_264 * -0x61c8864e7a143579 ^ (ulong)ptr_local;
    uVar3 = (ulong)*(byte *)(k1 + 4) * 0x27d4eb2f165667c5 ^
            (uVar3 << 0x17 | uVar3 >> 0x29) * -0x3d4d51c2d82b14b1 + 0x165667b19e3779f9;
    h64_local = XXH64_avalanche((uVar3 << 0xb | uVar3 >> 0x35) * -0x61c8864e7a143579);
    break;
  case 0x1e:
    if (align == XXH_unaligned) {
      if (endian == XXH_littleEndian) {
        local_4a8 = XXH_read64(ptr);
      }
      else {
        UVar2 = XXH_read64(ptr);
        local_4a8 = XXH_swap64(UVar2);
      }
      local_178 = local_4a8;
    }
    else {
      if (endian == XXH_littleEndian) {
        local_4b0 = *ptr;
      }
      else {
        local_4b0 = XXH_swap64(*ptr);
      }
      local_178 = local_4b0;
    }
    UVar2 = XXH64_round(0,local_178);
    k1 = (long)ptr + 8;
    ptr_local = (void *)(((UVar2 ^ h64) << 0x1b | (UVar2 ^ h64) >> 0x25) * -0x61c8864e7a143579 +
                        -0x7a1435883d4d519d);
  case 0x16:
    if (align == XXH_unaligned) {
      if (endian == XXH_littleEndian) {
        local_4b8 = XXH_read64((void *)k1);
      }
      else {
        UVar2 = XXH_read64((void *)k1);
        local_4b8 = XXH_swap64(UVar2);
      }
      local_190 = local_4b8;
    }
    else {
      if (endian == XXH_littleEndian) {
        local_4c0 = *(U64 *)k1;
      }
      else {
        local_4c0 = XXH_swap64(*(U64 *)k1);
      }
      local_190 = local_4c0;
    }
    UVar2 = XXH64_round(0,local_190);
    k1 = k1 + 8;
    ptr_local = (void *)(((UVar2 ^ (ulong)ptr_local) << 0x1b | (UVar2 ^ (ulong)ptr_local) >> 0x25) *
                         -0x61c8864e7a143579 + -0x7a1435883d4d519d);
  case 0xe:
    if (align == XXH_unaligned) {
      if (endian == XXH_littleEndian) {
        local_4c8 = XXH_read64((void *)k1);
      }
      else {
        UVar2 = XXH_read64((void *)k1);
        local_4c8 = XXH_swap64(UVar2);
      }
      local_1a8 = local_4c8;
    }
    else {
      if (endian == XXH_littleEndian) {
        local_4d0 = *(U64 *)k1;
      }
      else {
        local_4d0 = XXH_swap64(*(U64 *)k1);
      }
      local_1a8 = local_4d0;
    }
    UVar2 = XXH64_round(0,local_1a8);
    k1 = k1 + 8;
    ptr_local = (void *)(((UVar2 ^ (ulong)ptr_local) << 0x1b | (UVar2 ^ (ulong)ptr_local) >> 0x25) *
                         -0x61c8864e7a143579 + -0x7a1435883d4d519d);
  case 6:
    if (align == XXH_unaligned) {
      if (endian == XXH_littleEndian) {
        local_4d4 = XXH_read32((void *)k1);
      }
      else {
        UVar1 = XXH_read32((void *)k1);
        local_4d4 = XXH_swap32(UVar1);
      }
      local_27c = local_4d4;
    }
    else {
      if (endian == XXH_littleEndian) {
        local_4d8 = *(U32 *)k1;
      }
      else {
        local_4d8 = XXH_swap32(*(U32 *)k1);
      }
      local_27c = local_4d8;
    }
    uVar3 = (ulong)local_27c * -0x61c8864e7a143579 ^ (ulong)ptr_local;
    uVar3 = (ulong)*(byte *)(k1 + 4) * 0x27d4eb2f165667c5 ^
            (uVar3 << 0x17 | uVar3 >> 0x29) * -0x3d4d51c2d82b14b1 + 0x165667b19e3779f9;
    uVar3 = (ulong)*(byte *)(k1 + 5) * 0x27d4eb2f165667c5 ^
            (uVar3 << 0xb | uVar3 >> 0x35) * -0x61c8864e7a143579;
    h64_local = XXH64_avalanche((uVar3 << 0xb | uVar3 >> 0x35) * -0x61c8864e7a143579);
    break;
  case 0x1f:
    if (align == XXH_unaligned) {
      if (endian == XXH_littleEndian) {
        local_510 = XXH_read64(ptr);
      }
      else {
        UVar2 = XXH_read64(ptr);
        local_510 = XXH_swap64(UVar2);
      }
      local_208 = local_510;
    }
    else {
      if (endian == XXH_littleEndian) {
        local_518 = *ptr;
      }
      else {
        local_518 = XXH_swap64(*ptr);
      }
      local_208 = local_518;
    }
    UVar2 = XXH64_round(0,local_208);
    k1 = (long)ptr + 8;
    ptr_local = (void *)(((UVar2 ^ h64) << 0x1b | (UVar2 ^ h64) >> 0x25) * -0x61c8864e7a143579 +
                        -0x7a1435883d4d519d);
  case 0x17:
    if (align == XXH_unaligned) {
      if (endian == XXH_littleEndian) {
        local_520 = XXH_read64((void *)k1);
      }
      else {
        UVar2 = XXH_read64((void *)k1);
        local_520 = XXH_swap64(UVar2);
      }
      local_220 = local_520;
    }
    else {
      if (endian == XXH_littleEndian) {
        local_528 = *(U64 *)k1;
      }
      else {
        local_528 = XXH_swap64(*(U64 *)k1);
      }
      local_220 = local_528;
    }
    UVar2 = XXH64_round(0,local_220);
    k1 = k1 + 8;
    ptr_local = (void *)(((UVar2 ^ (ulong)ptr_local) << 0x1b | (UVar2 ^ (ulong)ptr_local) >> 0x25) *
                         -0x61c8864e7a143579 + -0x7a1435883d4d519d);
  case 0xf:
    if (align == XXH_unaligned) {
      if (endian == XXH_littleEndian) {
        local_530 = XXH_read64((void *)k1);
      }
      else {
        UVar2 = XXH_read64((void *)k1);
        local_530 = XXH_swap64(UVar2);
      }
      local_238 = local_530;
    }
    else {
      if (endian == XXH_littleEndian) {
        local_538 = *(U64 *)k1;
      }
      else {
        local_538 = XXH_swap64(*(U64 *)k1);
      }
      local_238 = local_538;
    }
    UVar2 = XXH64_round(0,local_238);
    k1 = k1 + 8;
    ptr_local = (void *)(((UVar2 ^ (ulong)ptr_local) << 0x1b | (UVar2 ^ (ulong)ptr_local) >> 0x25) *
                         -0x61c8864e7a143579 + -0x7a1435883d4d519d);
  case 7:
    if (align == XXH_unaligned) {
      if (endian == XXH_littleEndian) {
        local_53c = XXH_read32((void *)k1);
      }
      else {
        UVar1 = XXH_read32((void *)k1);
        local_53c = XXH_swap32(UVar1);
      }
      local_294 = local_53c;
    }
    else {
      if (endian == XXH_littleEndian) {
        local_540 = *(U32 *)k1;
      }
      else {
        local_540 = XXH_swap32(*(U32 *)k1);
      }
      local_294 = local_540;
    }
    uVar3 = (ulong)local_294 * -0x61c8864e7a143579 ^ (ulong)ptr_local;
    k1 = k1 + 4;
    ptr_local = (void *)((uVar3 << 0x17 | uVar3 >> 0x29) * -0x3d4d51c2d82b14b1 + 0x165667b19e3779f9)
    ;
  case 3:
    uVar3 = (ulong)*(byte *)k1 * 0x27d4eb2f165667c5 ^ (ulong)ptr_local;
    k1 = k1 + 1;
    ptr_local = (void *)((uVar3 << 0xb | uVar3 >> 0x35) * -0x61c8864e7a143579);
  case 2:
    uVar3 = (ulong)*(byte *)k1 * 0x27d4eb2f165667c5 ^ (ulong)ptr_local;
    k1 = k1 + 1;
    ptr_local = (void *)((uVar3 << 0xb | uVar3 >> 0x35) * -0x61c8864e7a143579);
  case 1:
    uVar3 = (ulong)*(byte *)k1 * 0x27d4eb2f165667c5 ^ (ulong)ptr_local;
    ptr_local = (void *)((uVar3 << 0xb | uVar3 >> 0x35) * -0x61c8864e7a143579);
  case 0:
    h64_local = XXH64_avalanche((U64)ptr_local);
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/xxhash/xxhash.c"
                  ,0x326,
                  "U64 XXH64_finalize(U64, const void *, size_t, XXH_endianess, XXH_alignment)");
  }
  return h64_local;
}

Assistant:

static U64
XXH64_finalize(U64 h64, const void* ptr, size_t len,
               XXH_endianess endian, XXH_alignment align)
{
    const BYTE* p = (const BYTE*)ptr;

#define PROCESS1_64          \
    h64 ^= (*p) * PRIME64_5; \
    p++;                     \
    h64 = XXH_rotl64(h64, 11) * PRIME64_1;

#define PROCESS4_64          \
    h64 ^= (U64)(XXH_get32bits(p)) * PRIME64_1; \
    p+=4;                    \
    h64 = XXH_rotl64(h64, 23) * PRIME64_2 + PRIME64_3;

#define PROCESS8_64 {        \
    U64 const k1 = XXH64_round(0, XXH_get64bits(p)); \
    p+=8;                    \
    h64 ^= k1;               \
    h64  = XXH_rotl64(h64,27) * PRIME64_1 + PRIME64_4; \
}

    switch(len&31) {
      case 24: PROCESS8_64;
                    /* fallthrough */
      case 16: PROCESS8_64;
                    /* fallthrough */
      case  8: PROCESS8_64;
               return XXH64_avalanche(h64);

      case 28: PROCESS8_64;
                    /* fallthrough */
      case 20: PROCESS8_64;
                    /* fallthrough */
      case 12: PROCESS8_64;
                    /* fallthrough */
      case  4: PROCESS4_64;
               return XXH64_avalanche(h64);

      case 25: PROCESS8_64;
                    /* fallthrough */
      case 17: PROCESS8_64;
                    /* fallthrough */
      case  9: PROCESS8_64;
               PROCESS1_64;
               return XXH64_avalanche(h64);

      case 29: PROCESS8_64;
                    /* fallthrough */
      case 21: PROCESS8_64;
                    /* fallthrough */
      case 13: PROCESS8_64;
                    /* fallthrough */
      case  5: PROCESS4_64;
               PROCESS1_64;
               return XXH64_avalanche(h64);

      case 26: PROCESS8_64;
                    /* fallthrough */
      case 18: PROCESS8_64;
                    /* fallthrough */
      case 10: PROCESS8_64;
               PROCESS1_64;
               PROCESS1_64;
               return XXH64_avalanche(h64);

      case 30: PROCESS8_64;
                    /* fallthrough */
      case 22: PROCESS8_64;
                    /* fallthrough */
      case 14: PROCESS8_64;
                    /* fallthrough */
      case  6: PROCESS4_64;
               PROCESS1_64;
               PROCESS1_64;
               return XXH64_avalanche(h64);

      case 27: PROCESS8_64;
                    /* fallthrough */
      case 19: PROCESS8_64;
                    /* fallthrough */
      case 11: PROCESS8_64;
               PROCESS1_64;
               PROCESS1_64;
               PROCESS1_64;
               return XXH64_avalanche(h64);

      case 31: PROCESS8_64;
                    /* fallthrough */
      case 23: PROCESS8_64;
                    /* fallthrough */
      case 15: PROCESS8_64;
                    /* fallthrough */
      case  7: PROCESS4_64;
                    /* fallthrough */
      case  3: PROCESS1_64;
                    /* fallthrough */
      case  2: PROCESS1_64;
                    /* fallthrough */
      case  1: PROCESS1_64;
                    /* fallthrough */
      case  0: return XXH64_avalanche(h64);
    }

    /* impossible to reach */
    assert(0);
    return 0;  /* unreachable, but some compilers complain without it */
}